

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O1

void __thiscall cppcms::sessions::session_file_storage::gc(session_file_storage *this)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  dirent *__entry;
  DIR *__dirp;
  size_t sVar4;
  int *piVar5;
  cppcms_error *this_00;
  ulong uVar6;
  char *__s;
  string sid;
  dirent *entry_p;
  locked_file file;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  dirent *local_c8;
  string local_c0;
  char *local_a0 [2];
  char local_90 [16];
  locked_file local_80;
  
  lVar3 = pathconf((this->path_)._M_dataplus._M_p,3);
  uVar6 = 0x218;
  if (-1 < (int)lVar3) {
    uVar6 = (long)(int)lVar3 + 0x119;
  }
  __entry = (dirent *)operator_new__(uVar6);
  __dirp = opendir((this->path_)._M_dataplus._M_p);
  if (__dirp == (DIR *)0x0) {
    piVar5 = __errno_location();
    iVar2 = *piVar5;
    this_00 = (cppcms_error *)__cxa_allocate_exception(0x30);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80,
                   "Failed to open directory :",&this->path_);
    cppcms_error::cppcms_error(this_00,iVar2,(string *)&local_80);
    __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
  }
  __s = __entry->d_name;
  do {
    iVar2 = readdir_r(__dirp,__entry,&local_c8);
    if ((iVar2 != 0) || (local_c8 == (dirent *)0x0)) {
      closedir(__dirp);
      operator_delete__(__entry);
      return;
    }
    lVar3 = 0;
    do {
      iVar2 = isxdigit((int)__entry->d_name[lVar3]);
      if (iVar2 == 0) goto LAB_0023ed30;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    lVar3 = 0x20;
LAB_0023ed30:
    if (((int)lVar3 == 0x20) && (__entry->d_name[0x20] == '\0')) {
      local_e8 = local_d8;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,__s,__s + sVar4);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c0,local_e8,local_e8 + local_e0);
      locked_file::locked_file(&local_80,this,&local_c0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (-1 < local_80.fd_) {
        bVar1 = read_timestamp(this,local_80.fd_);
        if (!bVar1) {
          local_a0[0] = local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a0,local_80.name_._M_dataplus._M_p,
                     local_80.name_._M_dataplus._M_p + local_80.name_._M_string_length);
          unlink(local_a0[0]);
          if (local_a0[0] != local_90) {
            operator_delete(local_a0[0]);
          }
        }
      }
      locked_file::~locked_file(&local_80);
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
    }
  } while( true );
}

Assistant:

void session_file_storage::gc()
{
	DIR *d=0;
	struct dirent *entry_st=0,*entry_p;
	int path_len=pathconf(path_.c_str(),_PC_NAME_MAX);
	if(path_len < 0 ) { 
		// Only "sessions" should be in this directory
		// also this directory has high level of trust
		// thus... Don't care about symlink exploits
		#ifdef NAME_MAX
		path_len=NAME_MAX;
		#elif defined(PATH_MAX)
		path_len=PATH_MAX;
		#else
		path_len=4096; // guess
		#endif
	}
	// this is for Solaris... 
	entry_st=(struct dirent *)new char[sizeof(struct dirent)+path_len+1];
	try{
		if((d=::opendir(path_.c_str()))==NULL) {
			int err=errno;
			throw cppcms_error(err,"Failed to open directory :"+path_);
		}
		while(::readdir_r(d,entry_st,&entry_p)==0 && entry_p!=NULL) {
			int i;
			for(i=0;i<32;i++) {
				if(!isxdigit(entry_st->d_name[i]))
					break;
			}
			if(i!=32 || entry_st->d_name[i]!=0) 
				continue;
			std::string sid=entry_st->d_name;
			{
				locked_file file(this,sid,false);
				if(file.fd() >=0 && !read_timestamp(file.fd()))
					::unlink(file.name().c_str());
			}
		}
		::closedir(d);
	}
	catch(...) {
		if(d) ::closedir(d);
		delete [] entry_st;
		throw;
	}
	delete [] entry_st;
}